

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

uint32_t spvtools::opt::anon_unknown_0::GetComponentTypeOfArrayMatrix
                   (DefUseManager *def_use_mgr,uint32_t type_id,uint32_t depth_to_component)

{
  uint32_t index;
  Instruction *this;
  bool bVar1;
  
  while( true ) {
    bVar1 = depth_to_component == 0;
    depth_to_component = depth_to_component - 1;
    if (bVar1) {
      return type_id;
    }
    this = analysis::DefUseManager::GetDef(def_use_mgr,type_id);
    if ((this->opcode_ | OpSourceExtension) != OpTypeArray) break;
    index = (this->has_result_id_ & 1) + 1;
    if (this->has_type_id_ == false) {
      index = (uint)this->has_result_id_;
    }
    type_id = Instruction::GetSingleWordOperand(this,index);
  }
  __assert_fail("type_inst->opcode() == spv::Op::OpTypeMatrix",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                ,0x56,
                "uint32_t spvtools::opt::(anonymous namespace)::GetComponentTypeOfArrayMatrix(analysis::DefUseManager *, uint32_t, uint32_t)"
               );
}

Assistant:

uint32_t GetComponentTypeOfArrayMatrix(analysis::DefUseManager* def_use_mgr,
                                       uint32_t type_id,
                                       uint32_t depth_to_component) {
  if (depth_to_component == 0) return type_id;

  Instruction* type_inst = def_use_mgr->GetDef(type_id);
  if (type_inst->opcode() == spv::Op::OpTypeArray) {
    uint32_t elem_type_id =
        type_inst->GetSingleWordInOperand(kOpTypeArrayElemTypeInOperandIndex);
    return GetComponentTypeOfArrayMatrix(def_use_mgr, elem_type_id,
                                         depth_to_component - 1);
  }

  assert(type_inst->opcode() == spv::Op::OpTypeMatrix);
  uint32_t column_type_id =
      type_inst->GetSingleWordInOperand(kOpTypeMatrixColTypeInOperandIndex);
  return GetComponentTypeOfArrayMatrix(def_use_mgr, column_type_id,
                                       depth_to_component - 1);
}